

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::FindObjectHelper<true,false>
              (RecyclableObject *obj,int64 length,int64 start,RecyclableObject *callBackFn,
              Var thisArg,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *this;
  BOOL BVar2;
  Var pvVar3;
  JavascriptMethod p_Var4;
  uint32 index;
  undefined1 local_60 [8];
  JsReentLock jsReentLock;
  
  local_60 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_60)->noJsReentrancy;
  ((ThreadContext *)local_60)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_60,obj);
  do {
    index = (uint32)start;
    if (length <= (long)(start & 0xffffffffU)) {
      jsReentLock._24_8_ = &DAT_10000ffffffff;
      break;
    }
    *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    pvVar3 = JavascriptOperators::GetItem(obj,index,scriptContext);
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    *(bool *)((long)local_60 + 0x108) = true;
    jsReentLock._24_8_ = JavascriptNumber::ToVar(index,scriptContext);
    *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    this = scriptContext->threadContext;
    bVar1 = this->reentrancySafeOrHandled;
    this->reentrancySafeOrHandled = true;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
    ThreadContext::AssertJsReentrancy(scriptContext->threadContext);
    p_Var4 = RecyclableObject::GetEntryPoint(callBackFn);
    CheckIsExecutable(callBackFn,p_Var4);
    p_Var4 = RecyclableObject::GetEntryPoint(callBackFn);
    pvVar3 = (*p_Var4)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,thisArg,pvVar3,
                       jsReentLock._24_8_,obj);
    this->reentrancySafeOrHandled = bVar1;
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    *(bool *)((long)local_60 + 0x108) = true;
    BVar2 = JavascriptConversion::ToBoolean(pvVar3,scriptContext);
    start = (int64)(index + 1);
  } while (BVar2 == 0);
  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return (Var)jsReentLock._24_8_;
}

Assistant:

Var JavascriptArray::FindObjectHelper(RecyclableObject* obj, int64 length, int64 start, RecyclableObject* callBackFn, Var thisArg, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        Var element = nullptr;
        Var testResult = nullptr;
        uint32 loopStart = reversed ? (uint32)length - 1 : (uint32)start;
        int8 loopDelta = reversed ? -1 : 1;

        for (uint32 k = loopStart; k < length; k += loopDelta)
        {
            JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(obj, k, scriptContext));
            Var index = JavascriptNumber::ToVar(k, scriptContext);

            JS_REENTRANT(jsReentLock,
                BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                {
                    testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg,
                            element,
                            index,
                            obj);
                }
                END_SAFE_REENTRANT_CALL
            );

            if (JavascriptConversion::ToBoolean(testResult, scriptContext))
            {
                return findIndex ? index : element;
            }
        }

        return findIndex ? JavascriptNumber::ToVar(-1, scriptContext) : scriptContext->GetLibrary()->GetUndefined();
    }